

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O0

int cfl_idx_to_alpha(uint8_t alpha_idx,int8_t joint_sign,CFL_PRED_TYPE pred_type)

{
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  int abs_alpha_q3;
  int alpha_sign;
  CFL_PRED_TYPE pred_type_local;
  int8_t joint_sign_local;
  uint8_t alpha_idx_local;
  undefined4 local_4;
  
  if (pred_type == '\0') {
    local_14 = (joint_sign + 1) * 0xb >> 5;
  }
  else {
    local_14 = joint_sign + 1 + ((joint_sign + 1) * 0xb >> 5) * -3;
  }
  if (local_14 == 0) {
    local_4 = 0;
  }
  else {
    if (pred_type == '\0') {
      local_18 = (int)(uint)alpha_idx >> 4;
    }
    else {
      local_18 = alpha_idx & 0xf;
    }
    if (local_14 == 2) {
      local_1c = local_18 + 1;
    }
    else {
      local_1c = -1 - local_18;
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

CFL_SUB_AVG_FN(c)

static inline int cfl_idx_to_alpha(uint8_t alpha_idx, int8_t joint_sign,
                                   CFL_PRED_TYPE pred_type) {
  const int alpha_sign = (pred_type == CFL_PRED_U) ? CFL_SIGN_U(joint_sign)
                                                   : CFL_SIGN_V(joint_sign);
  if (alpha_sign == CFL_SIGN_ZERO) return 0;
  const int abs_alpha_q3 =
      (pred_type == CFL_PRED_U) ? CFL_IDX_U(alpha_idx) : CFL_IDX_V(alpha_idx);
  return (alpha_sign == CFL_SIGN_POS) ? abs_alpha_q3 + 1 : -abs_alpha_q3 - 1;
}